

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1693b::InstrumentMemoryAccesses::runOnFunction
          (InstrumentMemoryAccesses *this,Function *F)

{
  CallBase *this_00;
  long lVar1;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *this_01;
  Type *DestTy;
  IntegerType *pIVar2;
  bool bVar3;
  atomic<bool> aVar4;
  uint uVar5;
  Function *pFVar6;
  DataLayout *pDVar7;
  CallBase *pCVar8;
  Value *pVVar9;
  Value *pVVar10;
  ulong uVar11;
  Function *Check;
  Function *pFVar12;
  Function *pFVar13;
  StringRef SVar14;
  StringRef SVar15;
  TypeSize TVar16;
  Child local_f8 [2];
  Value *local_d0;
  Function *local_c8;
  Function *local_c0;
  undefined1 local_b8 [128];
  code *local_38;
  
  SVar14.Length = (size_t)"__loadcheck";
  SVar14.Data = *(char **)(F + 0x28);
  pFVar6 = (Function *)llvm::Module::getFunction(SVar14);
  this->LoadCheckFunction = pFVar6;
  if (pFVar6 == (Function *)0x0) {
LAB_00106092:
    __assert_fail("LoadCheckFunction && \"__loadcheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x55,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  SVar15.Length = (size_t)"__storecheck";
  SVar15.Data = *(char **)(F + 0x28);
  pFVar6 = (Function *)llvm::Module::getFunction(SVar15);
  this->StoreCheckFunction = pFVar6;
  if (pFVar6 == (Function *)0x0) {
    __assert_fail("StoreCheckFunction && \"__storecheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x58,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  pDVar7 = (DataLayout *)llvm::Module::getDataLayout();
  this->TD = pDVar7;
  local_b8._64_8_ = llvm::Function::getContext();
  local_b8._72_8_ = local_b8 + 0x78;
  local_b8._80_8_ = &local_38;
  local_b8._0_8_ = local_b8 + 0x10;
  Check = (Function *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 2;
  local_b8._88_8_ = (MDNode *)0x0;
  local_b8._96_4_ = 0;
  local_b8[100] = false;
  local_b8[0x65] = ebStrict;
  local_b8[0x66] = Dynamic;
  local_b8._48_8_ = (BasicBlock *)0x0;
  local_b8._56_8_ = (node_pointer)0x0;
  local_b8._104_8_ = (OperandBundleDefT<llvm::Value_*> *)0x0;
  local_b8._112_8_ = 0;
  local_b8._120_8_ = llvm::Module::getDataLayout;
  local_38 = llvm::Pass::getAsImmutablePass;
  this->Builder = (IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b8;
  pFVar6 = *(Function **)(F + 0x50);
  pFVar12 = F + 0x48;
  if (pFVar6 == F + 0x48) {
LAB_00106038:
    llvm::IRBuilderDefaultInserter::~IRBuilderDefaultInserter((IRBuilderDefaultInserter *)&local_38)
    ;
    llvm::IRBuilderFolder::~IRBuilderFolder((IRBuilderFolder *)(local_b8 + 0x78));
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      free((void *)local_b8._0_8_);
    }
    return true;
  }
LAB_00105cb8:
  local_c8 = pFVar12;
  pFVar12 = pFVar6 + -0x18;
  if (pFVar6 == (Function *)0x0) {
    pFVar12 = (Function *)0x0;
  }
  local_c0 = *(Function **)(pFVar6 + 8);
  pFVar6 = *(Function **)(pFVar12 + 0x30);
switchD_00105d0a_caseD_1c:
  pFVar13 = pFVar6;
  if (pFVar13 == pFVar12 + 0x28) goto LAB_00106025;
  this_00 = (CallBase *)(pFVar13 + -0x18);
  pCVar8 = this_00;
  if (pFVar13 == (Function *)0x0) {
    pCVar8 = (CallBase *)0x0;
  }
  if (0x42 < (byte)pCVar8->field_0x10 - 0x1c) {
    llvm::llvm_unreachable_internal
              ((llvm *)"Unknown instruction type encountered!",
               "/usr/lib/llvm-14/include/llvm/IR/InstVisitor.h",(char *)0x79,(uint)Check);
    goto LAB_00106092;
  }
  pFVar6 = *(Function **)(pFVar13 + 8);
  switch((uint)(byte)pCVar8->field_0x10) {
  default:
    goto switchD_00105d0a_caseD_1c;
  case 0x3b:
    pIVar2 = this->SizeTy;
    TVar16 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)this_00);
    local_f8[0]._0_8_ =
         TVar16.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         Value + 7 >> 3;
    local_f8[0]._8_4_ =
         ZEXT14(TVar16.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar11 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_f8[0].ptrAndLength);
    pVVar9 = (Value *)llvm::ConstantInt::get(pIVar2,uVar11,false);
    Check = this->LoadCheckFunction;
    instrument(this,*(Value **)(pFVar13 + -0x38),pVVar9,Check,(Instruction *)this_00);
    LOCK();
    LoadsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)LoadsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar4 = LoadsInstrumented.Initialized;
    break;
  case 0x3c:
    TVar16 = llvm::DataLayout::getTypeSizeInBits
                       (this->TD,(Type *)**(undefined8 **)(pFVar13 + -0x58));
    local_f8[0]._0_8_ =
         TVar16.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         Value + 7 >> 3;
    local_f8[0]._8_4_ =
         ZEXT14(TVar16.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar11 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_f8[0].ptrAndLength);
    pVVar9 = (Value *)llvm::ConstantInt::get(this->SizeTy,uVar11,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(pFVar13 + -0x38),pVVar9,Check,(Instruction *)this_00);
    LOCK();
    StoresInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)StoresInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar4 = StoresInstrumented.Initialized;
    break;
  case 0x3f:
    pIVar2 = this->SizeTy;
    TVar16 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)this_00);
    local_f8[0]._0_8_ =
         TVar16.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         Value + 7 >> 3;
    local_f8[0]._8_4_ =
         ZEXT14(TVar16.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar11 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_f8[0].ptrAndLength);
    pVVar9 = (Value *)llvm::ConstantInt::get(pIVar2,uVar11,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(pFVar13 + -0x78),pVVar9,Check,(Instruction *)this_00);
    goto LAB_00105f84;
  case 0x40:
    pIVar2 = this->SizeTy;
    TVar16 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)this_00);
    local_f8[0]._0_8_ =
         TVar16.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         Value + 7 >> 3;
    local_f8[0]._8_4_ =
         ZEXT14(TVar16.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar11 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_f8[0].ptrAndLength);
    pVVar9 = (Value *)llvm::ConstantInt::get(pIVar2,uVar11,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(pFVar13 + -0x58),pVVar9,Check,(Instruction *)this_00);
LAB_00105f84:
    LOCK();
    AtomicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)AtomicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar4._M_base._M_i = AtomicsInstrumented.Initialized._M_base._M_i;
    break;
  case 0x53:
    lVar1 = *(long *)(pFVar13 + -0x38);
    if (((lVar1 == 0) || (*(char *)(lVar1 + 0x10) != '\0')) ||
       (Check = *(Function **)(lVar1 + 0x18), Check != *(Function **)(pFVar13 + 0x30)))
    goto switchD_00105d0a_caseD_1c;
    Check = (Function *)0xffffff41;
    uVar5 = *(int *)(lVar1 + 0x24) - 0xbf;
    if ((5 < uVar5) || (Check = (Function *)0x29, (0x29U >> (uVar5 & 0x1f) & 1) == 0))
    goto switchD_00105d0a_caseD_1c;
    llvm::IRBuilderBase::SetInsertPoint(&this->Builder->super_IRBuilderBase,(Instruction *)this_00);
    this_01 = this->Builder;
    local_d0 = llvm::CallBase::getArgOperand(this_00,2);
    DestTy = (Type *)this->SizeTy;
    llvm::Twine::Twine((Twine *)&local_f8[0].ptrAndLength,"");
    pVVar9 = llvm::IRBuilderBase::CreateIntCast
                       (&this_01->super_IRBuilderBase,local_d0,DestTy,false,
                        (Twine *)&local_f8[0].ptrAndLength);
    local_f8[0]._0_8_ = this_00;
    bVar3 = llvm::
            isa_impl_wrap<llvm::MemTransferInst,_const_llvm::MemIntrinsic_*,_const_llvm::MemIntrinsic_*>
            ::doit((MemIntrinsic **)&local_f8[0].twine);
    if (bVar3) {
      local_f8[0]._0_8_ = this_00;
      bVar3 = llvm::
              isa_impl_wrap<llvm::MemTransferInst,_const_llvm::MemIntrinsic_*,_const_llvm::MemIntrinsic_*>
              ::doit((MemIntrinsic **)&local_f8[0].twine);
      if (!bVar3) {
        __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                      "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x10d,
                      "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = llvm::MemTransferInst, Y = llvm::MemIntrinsic]"
                     );
      }
      llvm::CallBase::getArgOperand(this_00,1);
      pVVar10 = (Value *)llvm::Value::stripPointerCasts();
      instrument(this,pVVar10,pVVar9,this->LoadCheckFunction,(Instruction *)this_00);
    }
    llvm::CallBase::getArgOperand(this_00,0);
    pVVar10 = (Value *)llvm::Value::stripPointerCasts();
    Check = this->StoreCheckFunction;
    instrument(this,pVVar10,pVVar9,Check,(Instruction *)this_00);
    LOCK();
    IntrinsicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)IntrinsicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar4 = IntrinsicsInstrumented.Initialized;
  }
  if (((byte)aVar4._M_base._M_i & 1) == 0) {
    llvm::TrackingStatistic::RegisterStatistic();
  }
  goto switchD_00105d0a_caseD_1c;
LAB_00106025:
  pFVar6 = local_c0;
  pFVar12 = local_c8;
  if (local_c0 == local_c8) goto LAB_00106038;
  goto LAB_00105cb8;
}

Assistant:

bool InstrumentMemoryAccesses::runOnFunction(Function &F) {
    // Check that the load and store check functions are declared.
    LoadCheckFunction = F.getParent()->getFunction("__loadcheck");
    assert(LoadCheckFunction && "__loadcheck function has disappeared!\n");

    StoreCheckFunction = F.getParent()->getFunction("__storecheck");
    assert(StoreCheckFunction && "__storecheck function has disappeared!\n");

    TD = &F.getParent()->getDataLayout();
    IRBuilder<> TheBuilder(F.getContext());
    Builder = &TheBuilder;

    // Visit all of the instructions in the function.
    visit(F);
    return true;
}